

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *v,uint weight)

{
  uint *puVar1;
  undefined8 uVar2;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar3;
  uint uVar4;
  
  uVar2 = *(undefined8 *)v->m_s;
  uVar4 = (this->m_training_vecs).m_size;
  if ((this->m_training_vecs).m_capacity <= uVar4) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,uVar4 + 1,true,0xc,
               vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,false);
    uVar4 = (this->m_training_vecs).m_size;
  }
  ppVar3 = (this->m_training_vecs).m_p;
  *(undefined8 *)ppVar3[uVar4].first.m_s = uVar2;
  ppVar3[uVar4].second = weight;
  puVar1 = &(this->m_training_vecs).m_size;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight) {
    m_training_vecs.push_back(std::make_pair(v, weight));
  }